

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.h
# Opt level: O0

size_t asmjit::v1_14::Support::bitVectorIndexOf<unsigned_long>
                 (unsigned_long *buf,size_t start,bool value)

{
  uint uVar1;
  ulong uVar2;
  unsigned_long bits;
  unsigned_long kFlipMask;
  unsigned_long kFillMask;
  unsigned_long *p;
  size_t bitIndex;
  size_t vecIndex;
  size_t kTSizeInBits;
  bool value_local;
  size_t start_local;
  unsigned_long *buf_local;
  
  uVar2 = 0xffffffffffffffff;
  if (value) {
    uVar2 = 0;
  }
  bits = (buf[start >> 6] ^ uVar2) & -1L << ((byte)start & 0x3f);
  p = buf + (start >> 6);
  while (bits == 0) {
    bits = p[1] ^ uVar2;
    p = p + 1;
  }
  uVar1 = 0;
  for (; (bits & 1) == 0; bits = bits >> 1 | 0x8000000000000000) {
    uVar1 = uVar1 + 1;
  }
  return ((long)p - (long)buf >> 3) * 0x40 + (ulong)uVar1;
}

Assistant:

static ASMJIT_FORCE_INLINE size_t bitVectorIndexOf(T* buf, size_t start, bool value) noexcept {
  const size_t kTSizeInBits = bitSizeOf<T>();
  size_t vecIndex = start / kTSizeInBits; // T[]
  size_t bitIndex = start % kTSizeInBits; // T[][]

  T* p = buf + vecIndex;

  // We always look for zeros, if value is `true` we have to flip all bits before the search.
  const T kFillMask = allOnes<T>();
  const T kFlipMask = value ? T(0) : kFillMask;

  // The first BitWord requires special handling as there are some bits we want to ignore.
  T bits = (*p ^ kFlipMask) & (kFillMask << bitIndex);
  for (;;) {
    if (bits)
      return (size_t)(p - buf) * kTSizeInBits + ctz(bits);
    bits = *++p ^ kFlipMask;
  }
}